

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

ssize_t __thiscall rudp::session::send(session *this,int __fd,void *__buf,size_t __n,int __flags)

{
  byte bVar1;
  uint8_t uVar2;
  bool bVar3;
  uint16_t value;
  int iVar4;
  ssize_t extraout_RAX;
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar5;
  byte *pbVar6;
  undefined8 uVar7;
  ulong uVar8;
  size_type sVar9;
  iterator __first;
  iterator __last;
  uchar *puVar10;
  uchar *puVar11;
  reference puVar12;
  reference this_00;
  reference this_01;
  ssize_t extraout_RAX_00;
  ssize_t sVar13;
  undefined4 in_register_00000034;
  __shared_ptr *this_02;
  function<void_(bool)> *cb_1;
  iterator __end1;
  iterator __begin1;
  vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> *__range1;
  undefined1 local_b8 [6];
  uint16_t sum;
  byte local_85;
  undefined1 auStack_84 [7];
  uint8_t sequence_number;
  uint16_t local_7c;
  uint16_t uStack_7a;
  uint8_t uStack_78;
  uint8_t uStack_77;
  uint8_t uStack_76;
  uint8_t uStack_75;
  uint32_t local_74;
  vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> *local_70;
  vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> *local_68;
  byte local_5b;
  byte local_5a;
  byte local_59;
  undefined4 local_58;
  bool has_data;
  uchar header_size;
  bool ack;
  undefined1 local_48 [8];
  vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> cbs;
  bool tcs;
  bool nul;
  bool rst;
  bool syn;
  send_cb_t *cb_local;
  bool resend_local;
  buffer_ptr_t *incoming_local;
  session *this_local;
  
  this_02 = (__shared_ptr *)CONCAT44(in_register_00000034,__fd);
  bVar3 = std::__shared_ptr::operator_cast_to_bool(this_02);
  if (bVar3) {
    pvVar5 = &std::
              __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_02)->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
    ;
    pbVar6 = boost::container::
             vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
             ::operator[](pvVar5,0);
    cbs.super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (*pbVar6 & 0x80) != 0;
    pvVar5 = &std::
              __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_02)->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
    ;
    pbVar6 = boost::container::
             vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
             ::operator[](pvVar5,0);
    cbs.super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = (*pbVar6 & 0x10) != 0;
    pvVar5 = &std::
              __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_02)->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
    ;
    pbVar6 = boost::container::
             vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
             ::operator[](pvVar5,0);
    cbs.super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = (*pbVar6 & 8) != 0;
    pvVar5 = &std::
              __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_02)->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
    ;
    pbVar6 = boost::container::
             vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
             ::operator[](pvVar5,0);
    cbs.super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = (*pbVar6 & 2) != 0;
    std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::vector
              ((vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> *)
               local_48);
    if ((((((ulong)__buf & 1) == 0) && (this->state != opened)) &&
        ((cbs.
          super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0)) &&
       ((cbs.
         super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ & 1) == 0)) {
      std::function<void_(bool)>::operator()((function<void_(bool)> *)__n,false);
      local_58 = 1;
    }
    else {
      bVar3 = ready_to_send(this);
      if (bVar3) {
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        pbVar6 = boost::container::
                 vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 ::operator[](pvVar5,0);
        local_59 = (byte)((*pbVar6 & 0x40) >> 6);
        bVar3 = check_common_header(this,(buffer_ptr_t *)this_02);
        if (!bVar3) {
          uVar7 = __cxa_allocate_exception(1);
          __cxa_throw(uVar7,&invalid_packet::typeinfo,0);
        }
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        pbVar6 = boost::container::
                 vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 ::operator[](pvVar5,1);
        local_5a = *pbVar6;
        uVar8 = (ulong)local_5a;
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        sVar9 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::size(pvVar5);
        if (sVar9 < uVar8) {
          uVar7 = __cxa_allocate_exception(1);
          __cxa_throw(uVar7,&invalid_packet::typeinfo,0);
        }
        if (local_5a < 4) {
          uVar7 = __cxa_allocate_exception(1);
          __cxa_throw(uVar7,&invalid_packet::typeinfo,0);
        }
        uVar8 = (ulong)local_5a;
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        sVar9 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::size(pvVar5);
        local_5b = uVar8 != sVar9;
        if ((cbs.
             super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          __first = std::
                    array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
                    ::begin(&this->send_buffer);
          __last = std::
                   array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
                   ::end(&this->send_buffer);
          local_68 = (vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                      *)local_48;
          local_70 = (vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                      *)std::
                        for_each<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*,rudp::session::send(std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&,bool,std::function<void(bool)>const&)::__0>
                                  (__first,__last,(anon_class_8_1_ba1d3b54)local_68);
          iVar4 = rand();
          this->send_head = (uint8_t)iVar4;
          this->acknowledge_head = this->send_head;
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this_02)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          puVar10 = boost::container::
                    vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                    ::data(pvVar5);
          puVar10 = std::next<unsigned_char*>(puVar10,4);
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this_02)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          puVar11 = boost::container::
                    vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                    ::data(pvVar5);
          puVar11 = std::next<unsigned_char*>(puVar11,(long)(int)(local_5a - 2));
          session_config::session_config((session_config *)auStack_84,puVar10,puVar11);
          (this->self_config).max_out_of_standing_segs = auStack_84[0];
          (this->self_config).option_flags = auStack_84[1];
          (this->self_config).maximum_segment_size = auStack_84._2_2_;
          (this->self_config).retransmission_timeout_value = auStack_84._4_2_;
          (this->self_config).cumulative_ack_timeout_value = stack0xffffffffffffff82;
          (this->self_config).null_segment_timeout_value = local_7c;
          (this->self_config).transfer_state_timeout_value = uStack_7a;
          (this->self_config).max_retrans = uStack_78;
          (this->self_config).max_cum_ack = uStack_77;
          (this->self_config).max_out_of_seq = uStack_76;
          (this->self_config).max_auto_reset = uStack_75;
          (this->self_config).connection_identifier = local_74;
          this->state = opened;
        }
        if ((cbs.
             super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
          this->state = closed;
        }
        local_85 = this->send_head;
        this->send_head = local_85 + 1;
        uVar8 = (ulong)local_5a;
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        sVar9 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::size(pvVar5);
        if (uVar8 == sVar9) {
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_02)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          pbVar6 = boost::container::
                   vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                   ::operator[](pvVar5,0);
          bVar1 = *pbVar6;
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_02)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          pbVar6 = boost::container::
                   vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                   ::operator[](pvVar5,0);
          *pbVar6 = bVar1 & 0xfb;
        }
        else {
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_02)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          pbVar6 = boost::container::
                   vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                   ::operator[](pvVar5,0);
          bVar1 = *pbVar6;
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_02)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          pbVar6 = boost::container::
                   vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                   ::operator[](pvVar5,0);
          *pbVar6 = bVar1 | 4;
        }
        bVar1 = local_85;
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        pbVar6 = boost::container::
                 vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 ::operator[](pvVar5,2);
        *pbVar6 = bVar1;
        if ((local_59 & 1) != 0) {
          uVar2 = this->receive_head;
          pvVar5 = &std::
                    __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_02)->
                    super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ;
          puVar12 = boost::container::
                    vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                    ::operator[](pvVar5,3);
          *puVar12 = uVar2 + 0xff;
        }
        std::
        make_pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&,std::function<void(bool)>const&>
                  ((pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
                    *)local_b8,
                   (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
                   this_02,(function<void_(bool)> *)__n);
        this_00 = std::
                  array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
                  ::operator[](&this->send_buffer,(ulong)local_85);
        std::
        pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
        ::operator=(this_00,(type)local_b8);
        std::
        pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
        ::~pair((type)local_b8);
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        puVar10 = boost::container::
                  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                  ::data(pvVar5);
        puVar10 = std::next<unsigned_char*>(puVar10,(long)(int)(local_5a - 2));
        to_be16(puVar10,0);
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        puVar10 = boost::container::
                  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                  ::data(pvVar5);
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        puVar11 = boost::container::
                  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                  ::data(pvVar5);
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        sVar9 = boost::container::
                vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ::size(pvVar5);
        puVar11 = std::next<unsigned_char*>(puVar11,sVar9);
        value = checksum(puVar10,puVar11);
        pvVar5 = &std::
                  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this_02)->
                  super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ;
        puVar10 = boost::container::
                  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                  ::data(pvVar5);
        puVar10 = std::next<unsigned_char*>(puVar10,(long)(int)(local_5a - 2));
        to_be16(puVar10,value);
        send_packet(this,(buffer_ptr_t *)this_02,(send_cb_t *)__n);
        this->unacknowledged_packet_count = this->unacknowledged_packet_count + 1;
        reset_cumulative_ack_counter(this);
        set_null_segment_timer(this);
        if ((((local_5b & 1) != 0) ||
            ((cbs.
              super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0)) ||
           ((cbs.
             super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0)) {
          set_retransmission_timer(this,local_85);
        }
        __end1 = std::
                 vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
                 begin((vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                        *)local_48);
        cb_1 = (function<void_(bool)> *)
               std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
               ::end((vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                      *)local_48);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<std::function<void_(bool)>_*,_std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>_>
                                      *)&cb_1);
          if (!bVar3) break;
          this_01 = __gnu_cxx::
                    __normal_iterator<std::function<void_(bool)>_*,_std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>_>
                    ::operator*(&__end1);
          std::function<void_(bool)>::operator()(this_01,false);
          __gnu_cxx::
          __normal_iterator<std::function<void_(bool)>_*,_std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>_>
          ::operator++(&__end1);
        }
        local_58 = 0;
      }
      else {
        std::
        queue<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>>
        ::
        emplace<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&,std::function<void(bool)>const&>
                  ((queue<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>>
                    *)&this->pending,
                   (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
                   this_02,(function<void_(bool)> *)__n);
        local_58 = 1;
      }
    }
    std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::~vector
              ((vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> *)
               local_48);
    sVar13 = extraout_RAX_00;
  }
  else {
    std::function<void_(bool)>::operator()((function<void_(bool)> *)__n,false);
    sVar13 = extraout_RAX;
  }
  return sVar13;
}

Assistant:

void session::send( const buffer_ptr_t &incoming, bool resend, const send_cb_t &cb ) {
    if( !incoming ) {
      cb( false );
      return;
    }
    const bool syn = (*incoming)[ 0 ] & 0x80;
    const bool rst = (*incoming)[ 0 ] & 0x10;
    const bool nul = (*incoming)[ 0 ] & 0x08;
    const bool tcs = (*incoming)[ 0 ] & 0x02;
    std::vector< send_cb_t > cbs;
    if( !resend && state != session_state::opened && !syn && !tcs ) {
      cb( false );
      return;
    }
    if( !ready_to_send() ) {
      pending.emplace( incoming, cb );
      return;
    }
    const bool ack = (*incoming)[ 0 ] & 0x40;
    if( !check_common_header( incoming ) ) throw invalid_packet();
    const auto header_size = (*incoming)[ 1 ];
    if( header_size > incoming->size() ) throw invalid_packet();
    if( header_size < 4 ) throw invalid_packet();
    bool has_data = header_size != incoming->size();
    if( syn ) {
      std::for_each( send_buffer.begin(), send_buffer.end(), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
      send_head = rand();
      acknowledge_head = send_head;
      self_config = session_config( std::next( incoming->data(), 4 ), std::next( incoming->data(), header_size - 2 ) );
      state = session_state::opened;
    }
    if( rst ) {
      state = session_state::closed;
    }
    const auto sequence_number = send_head++;
    if( header_size != incoming->size() ) (*incoming)[ 0 ] = (*incoming)[ 0 ] | 0x04;
    else (*incoming)[ 0 ] = (*incoming)[ 0 ] & 0xFB;
    (*incoming)[ 2 ] = sequence_number;
    if( ack )  (*incoming)[ 3 ] = receive_head - 1;
    send_buffer[ sequence_number ] = std::make_pair( incoming, cb );
    to_be16( std::next( incoming->data(), header_size - 2 ), 0 );
    const auto sum = rudp::checksum( incoming->data(), std::next( incoming->data(), incoming->size() ) );
    to_be16( std::next( incoming->data(), header_size - 2 ), sum );
    send_packet( incoming, cb );
    ++unacknowledged_packet_count;
    reset_cumulative_ack_counter();
    set_null_segment_timer();
    if( has_data || nul || rst ) {
      //clear_retransmission_timer( sequence_number, sequence_number + 1u );
      set_retransmission_timer( sequence_number );
    }
    for( auto &cb: cbs ) {
      cb( false );
    }
  }